

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O1

void __thiscall spectest::JSONParser::SkipWhitespace(JSONParser *this)

{
  int iVar1;
  uint uVar2;
  
  do {
    iVar1 = ReadChar(this);
    uVar2 = iVar1 + 1;
    if (0x21 < uVar2) goto LAB_00125403;
  } while ((0x200004c00U >> ((ulong)uVar2 & 0x3f) & 1) != 0);
  if ((ulong)uVar2 == 0) {
    return;
  }
LAB_00125403:
  PutbackChar(this);
  return;
}

Assistant:

void JSONParser::SkipWhitespace() {
  while (1) {
    switch (ReadChar()) {
      case -1:
        return;

      case ' ':
      case '\t':
      case '\n':
      case '\r':
        break;

      default:
        PutbackChar();
        return;
    }
  }
}